

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QBGPlanner_TreeIncPruneBnB.cpp
# Opt level: O0

vector<AlphaVector,_std::allocator<AlphaVector>_> * __thiscall
QBGPlanner_TreeIncPruneBnB::GetGaoa(QBGPlanner_TreeIncPruneBnB *this,Index a,Index o,Index aPrime)

{
  E *this_00;
  undefined8 uVar1;
  reference ppvVar2;
  int in_ECX;
  index in_stack_ffffffffffffff38;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *pvVar3;
  sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_1UL>
  *in_stack_ffffffffffffff40;
  undefined1 *idx;
  multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>
  *in_stack_ffffffffffffff58;
  undefined1 local_58 [68];
  int local_14;
  
  idx = local_58;
  local_14 = in_ECX;
  boost::multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>::operator[]
            (in_stack_ffffffffffffff58,(index)idx);
  boost::detail::multi_array::
  sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_2UL>::operator[]
            ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_2UL> *)
             in_stack_ffffffffffffff58,(index)idx);
  this_00 = (E *)boost::detail::multi_array::
                 sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_1UL>::
                 operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  pvVar3 = (vector<AlphaVector,_std::allocator<AlphaVector>_> *)this_00->_vptr_E;
  boost::detail::multi_array::
  sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_1UL>::~sub_array
            ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_1UL> *)0x94ccf7);
  boost::detail::multi_array::
  sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_2UL>::~sub_array
            ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_2UL> *)0x94cd04);
  if (pvVar3 == (vector<AlphaVector,_std::allocator<AlphaVector>_> *)0x0) {
    uVar1 = __cxa_allocate_exception(0x28);
    E::E(this_00,(char *)pvVar3);
    __cxa_throw(uVar1,&E::typeinfo,E::~E);
  }
  if (local_14 == -1) {
    uVar1 = __cxa_allocate_exception(0x28);
    E::E(this_00,(char *)pvVar3);
    __cxa_throw(uVar1,&E::typeinfo,E::~E);
  }
  boost::multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>::operator[]
            (in_stack_ffffffffffffff58,(index)idx);
  boost::detail::multi_array::
  sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_2UL>::operator[]
            ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_2UL> *)
             in_stack_ffffffffffffff58,(index)idx);
  ppvVar2 = boost::detail::multi_array::
            sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_1UL>::operator[]
                      ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_1UL> *)
                       this_00,(index)pvVar3);
  pvVar3 = *ppvVar2;
  boost::detail::multi_array::
  sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_1UL>::~sub_array
            ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_1UL> *)0x94ce91);
  boost::detail::multi_array::
  sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_2UL>::~sub_array
            ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_2UL> *)0x94ce9b);
  return pvVar3;
}

Assistant:

std::vector<AlphaVector>* QBGPlanner_TreeIncPruneBnB::GetGaoa(Index a, Index o, Index aPrime) const
{
    if((*_m_Gaoa)[a][o][aPrime]==0)
        throw(E("QBGPlanner_TreeIncPruneBnB::GetGaoa set should have been computed"));

    if(aPrime==UNSPECIFIED_ACTION)
        throw(E("QBGPlanner_TreeIncPruneBnB::GetGaoa the next time step action should be specified"));

    return((*_m_Gaoa)[a][o][aPrime]);
}